

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

size_t Curl_is_absolute_url(char *url,char *buf,size_t buflen,_Bool guess_scheme)

{
  size_t n;
  size_t sVar1;
  byte bVar2;
  long lVar3;
  
  if (buf != (char *)0x0) {
    *buf = '\0';
  }
  if ((byte)((*url & 0xdfU) + 0xbf) < 0x1a) {
    for (lVar3 = 2; lVar3 != 0x29; lVar3 = lVar3 + 1) {
      bVar2 = url[lVar3 + -1];
      if (bVar2 == 0) {
        return 0;
      }
      if (((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) &&
         ((0x2e < bVar2 || ((0x680000000000U >> ((ulong)bVar2 & 0x3f) & 1) == 0))))
      goto LAB_0015ce99;
    }
    bVar2 = url[0x28];
LAB_0015ce99:
    if (bVar2 == 0x3a) {
      n = lVar3 - 1;
      sVar1 = 0;
      if (url[lVar3] == '/' || !guess_scheme) {
        sVar1 = n;
      }
      if (buf == (char *)0x0) {
        return sVar1;
      }
      if (url[lVar3] != '/' && guess_scheme) {
        return sVar1;
      }
      Curl_strntolower(buf,url,n);
      buf[lVar3 + -1] = '\0';
      return n;
    }
  }
  return 0;
}

Assistant:

size_t Curl_is_absolute_url(const char *url, char *buf, size_t buflen,
                            bool guess_scheme)
{
  size_t i = 0;
  DEBUGASSERT(!buf || (buflen > MAX_SCHEME_LEN));
  (void)buflen; /* only used in debug-builds */
  if(buf)
    buf[0] = 0; /* always leave a defined value in buf */
#ifdef _WIN32
  if(guess_scheme && STARTS_WITH_DRIVE_PREFIX(url))
    return 0;
#endif
  if(ISALPHA(url[0]))
    for(i = 1; i < MAX_SCHEME_LEN; ++i) {
      char s = url[i];
      if(s && (ISALNUM(s) || (s == '+') || (s == '-') || (s == '.') )) {
        /* RFC 3986 3.1 explains:
           scheme      = ALPHA *( ALPHA / DIGIT / "+" / "-" / "." )
        */
      }
      else {
        break;
      }
    }
  if(i && (url[i] == ':') && ((url[i + 1] == '/') || !guess_scheme)) {
    /* If this does not guess scheme, the scheme always ends with the colon so
       that this also detects data: URLs etc. In guessing mode, data: could
       be the hostname "data" with a specified port number. */

    /* the length of the scheme is the name part only */
    size_t len = i;
    if(buf) {
      Curl_strntolower(buf, url, i);
      buf[i] = 0;
    }
    return len;
  }
  return 0;
}